

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::PolyOffsetBuilder::DoSquare(PolyOffsetBuilder *this,double mul)

{
  double dVar1;
  double __y;
  double dVar2;
  size_t sVar3;
  pointer pDVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar8;
  double dVar9;
  double dVar10;
  IntPoint local_58;
  undefined1 local_48 [16];
  double local_30;
  IntPoint local_28;
  
  sVar3 = this->m_j;
  pDVar4 = (this->normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = *(long *)&(this->m_p).
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl;
  dVar8 = (double)*(long *)(lVar6 + sVar3 * 0x10);
  dVar1 = pDVar4[this->m_k].X;
  __y = pDVar4[this->m_k].Y;
  dVar2 = this->m_delta;
  dVar9 = dVar1 * dVar2 + dVar8;
  uVar7 = -(ulong)(dVar9 < 0.0);
  lVar5 = (long)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
  dVar9 = (double)*(long *)(lVar6 + 8 + sVar3 * 0x10);
  dVar10 = __y * dVar2 + dVar9;
  uVar7 = -(ulong)(dVar10 < 0.0);
  lVar6 = (long)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar10);
  dVar8 = pDVar4[sVar3].X * dVar2 + dVar8;
  uVar7 = -(ulong)(dVar8 < 0.0);
  local_58.X = (long64)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar8);
  dVar9 = pDVar4[sVar3].Y * dVar2 + dVar9;
  uVar7 = -(ulong)(dVar9 < 0.0);
  local_58.Y = (long64)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
  local_28.X = lVar5;
  local_28.Y = lVar6;
  if (0.0 <= (dVar1 * pDVar4[sVar3].Y - pDVar4[sVar3].X * __y) * dVar2) {
    local_48._8_4_ = in_XMM0_Dc;
    local_48._0_8_ = mul;
    local_48._12_4_ = in_XMM0_Dd;
    local_30 = atan2(__y,dVar1);
    pDVar4 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar1 = atan2(-pDVar4[this->m_j].Y,-pDVar4[this->m_j].X);
    dVar1 = ABS(dVar1 - local_30);
    dVar1 = tan((3.141592653589793 -
                (double)(~-(ulong)(3.141592653589793 < dVar1) & (ulong)dVar1 |
                        (ulong)(6.283185307179586 - dVar1) & -(ulong)(3.141592653589793 < dVar1))) *
                0.25);
    local_48._0_8_ = ABS((double)local_48._0_8_ * this->m_delta) * dVar1;
    local_48._8_8_ = local_48._8_8_ & 0x7fffffffffffffff;
    pDVar4 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_28.X = (long64)((double)lVar5 - pDVar4[this->m_k].Y * (double)local_48._0_8_);
    local_28.Y = (long64)(pDVar4[this->m_k].X * (double)local_48._0_8_ + (double)lVar6);
    AddPoint(this,&local_28);
    pDVar4 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_58.X = (long64)(pDVar4[this->m_j].Y * (double)local_48._0_8_ + (double)local_58.X);
    local_58.Y = (long64)((double)local_58.Y - (double)local_48._0_8_ * pDVar4[this->m_j].X);
  }
  else {
    AddPoint(this,&local_28);
    AddPoint(this,(IntPoint *)
                  (this->m_j * 0x10 +
                  *(long *)&(this->m_p).
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl));
  }
  AddPoint(this,&local_58);
  return;
}

Assistant:

void DoSquare(double mul = 1.0)
{
    IntPoint pt1 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_k].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_k].Y * m_delta));
    IntPoint pt2 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_j].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_j].Y * m_delta));
    if ((normals[m_k].X * normals[m_j].Y - normals[m_j].X * normals[m_k].Y) * m_delta >= 0)
    {
      double a1 = std::atan2(normals[m_k].Y, normals[m_k].X);
      double a2 = std::atan2(-normals[m_j].Y, -normals[m_j].X);
      a1 = std::fabs(a2 - a1);
      if (a1 > pi) a1 = pi * 2 - a1;
      double dx = std::tan((pi - a1)/4) * std::fabs(m_delta * mul);
      pt1 = IntPoint((long64)(pt1.X -normals[m_k].Y * dx),
        (long64)(pt1.Y + normals[m_k].X * dx));
      AddPoint(pt1);
      pt2 = IntPoint((long64)(pt2.X + normals[m_j].Y * dx),
        (long64)(pt2.Y -normals[m_j].X * dx));
      AddPoint(pt2);
    }
    else
    {
      AddPoint(pt1);
      AddPoint(m_p[m_i][m_j]);
      AddPoint(pt2);
    }
}